

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O0

void __thiscall bal::Formula::named_variables_update(Formula *this,VariablesArray *source)

{
  iterator this_00;
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  _Self local_28;
  _Self local_20;
  iterator vit;
  VariablesArray *source_local;
  Formula *this_local;
  
  vit._M_node = (_Base_ptr)source;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>_>_>
       ::begin(&this->named_variables_);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>_>_>
         ::end(&this->named_variables_);
    bVar1 = std::operator!=(&local_20,&local_28);
    this_00 = vit;
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>_>
             ::operator->(&local_20);
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>_>
             ::operator->(&local_20);
    VariablesArray::assign_template_into
              ((VariablesArray *)this_00._M_node,&ppVar2->second,&ppVar3->second);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bal::VariablesArray>_>
    ::operator++(&local_20,0);
  }
  return;
}

Assistant:

void Formula::named_variables_update(const VariablesArray& source) {
        for (auto vit = named_variables_.begin(); vit != named_variables_.end(); vit++) {
            source.assign_template_into(vit->second, vit->second);
        };
    }